

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txt_to_cpp.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  ifstream fi;
  byte abStack_418 [488];
  ofstream fo;
  byte abStack_210 [480];
  
  if (argc == 4) {
    std::ofstream::ofstream(&fo,argv[1],_S_out);
    std::ifstream::ifstream(&fi,argv[2],_S_in);
    iVar3 = 2;
    if (((abStack_418[*(long *)(_fi + -0x18)] & 5) == 0) &&
       ((abStack_210[*(long *)(_fo + -0x18)] & 5) == 0)) {
      poVar4 = std::operator<<((ostream *)&fo,"char ");
      poVar4 = std::operator<<(poVar4,argv[3]);
      std::operator<<(poVar4,"[] = {");
      uVar1 = 0;
      do {
        uVar2 = uVar1;
        iVar3 = std::istream::get();
        if ((abStack_418[*(long *)(_fi + -0x18)] & 2) != 0) {
          iVar3 = 0;
        }
        if (uVar2 == 0) {
LAB_00101374:
          std::operator<<((ostream *)&fo,"\n    ");
        }
        else {
          std::operator<<((ostream *)&fo,", ");
          if ((uVar2 & 0xf) == 0) goto LAB_00101374;
        }
        std::ostream::operator<<((ostream *)&fo,iVar3);
        uVar1 = uVar2 + 1;
      } while ((abStack_418[*(long *)(_fi + -0x18)] & 2) == 0);
      if (uVar2 != 0) {
        std::operator<<((ostream *)&fo,"\n");
      }
      iVar3 = 0;
      std::operator<<((ostream *)&fo,"};\n");
    }
    std::ifstream::~ifstream(&fi);
    std::ofstream::~ofstream(&fo);
  }
  else {
    iVar3 = 1;
    usage(*argv,"nb args",1);
  }
  return iVar3;
}

Assistant:

int main( int argc, char **argv ) {
    if ( argc != 4 )
        return usage( argv[ 0 ], "nb args", 1 );
    std::ofstream fo( argv[ 1 ] );
    std::ifstream fi( argv[ 2 ] );
    if ( not fi or not fo )
        return 2;

    fo << "char " << argv[ 3 ] << "[] = {";
    for( int i = 0; ; ++i ) {
        int c = fi.get();
        if ( fi.eof() )
            c = 0;

        if ( i )
            fo << ", ";
        if ( i % 16 == 0 )
            fo << "\n    ";
        fo << c;

        if ( fi.eof() ) {
            if ( i )
                fo << "\n";
            break;
        }
    }
    fo << "};\n";

    return 0;
}